

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

size_t __thiscall Diligent::PipelineStateVkImpl::ShaderStageInfo::Count(ShaderStageInfo *this)

{
  char (*Args_1) [32];
  string msg;
  
  Args_1 = (char (*) [32])
           ((long)(this->Shaders).
                  super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->Shaders).
                  super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3);
  if (Args_1 != (char (*) [32])
                (((long)(this->SPIRVs).
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->SPIRVs).
                       super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x18)) {
    FormatString<char[26],char[32]>
              (&msg,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"Shaders.size() == SPIRVs.size()",Args_1);
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"Count",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x24b);
    std::__cxx11::string::~string((string *)&msg);
    Args_1 = (char (*) [32])
             ((long)(this->Shaders).
                    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->Shaders).
                    super__Vector_base<const_Diligent::ShaderVkImpl_*,_std::allocator<const_Diligent::ShaderVkImpl_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3);
  }
  return (size_t)Args_1;
}

Assistant:

PipelineStateVkImpl::PipelineStateVkImpl(IReferenceCounters* pRefCounters, RenderDeviceVkImpl* pDeviceVk, const RayTracingPipelineStateCreateInfo& CreateInfo) :
    TPipelineStateBase{pRefCounters, pDeviceVk, CreateInfo}
{
    Construct<ShaderVkImpl>(CreateInfo);
}